

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractbutton.cpp
# Opt level: O0

void __thiscall QAbstractButton::changeEvent(QAbstractButton *this,QEvent *e)

{
  long lVar1;
  bool bVar2;
  Type TVar3;
  QAbstractButtonPrivate *this_00;
  QWidget *in_RSI;
  QSize *in_RDI;
  long in_FS_OFFSET;
  QAbstractButtonPrivate *d;
  QSize local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QAbstractButton *)0x50122f);
  TVar3 = QEvent::type((QEvent *)in_RSI);
  if (TVar3 == EnabledChange) {
    bVar2 = QWidget::isEnabled((QWidget *)0x50124f);
    if ((!bVar2) && (((byte)this_00->field_0x28c >> 4 & 1) != 0)) {
      this_00->field_0x28c = this_00->field_0x28c & 0xef;
      QAbstractButtonPrivate::emitReleased(this_00);
    }
  }
  else {
    QSize::QSize(in_RDI);
    this_00->sizeHint = local_10;
  }
  QWidget::changeEvent(in_RSI,(QEvent *)this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractButton::changeEvent(QEvent *e)
{
    Q_D(QAbstractButton);
    switch (e->type()) {
    case QEvent::EnabledChange:
        if (!isEnabled() && d->down) {
            d->down = false;
            d->emitReleased();
        }
        break;
    default:
        d->sizeHint = QSize();
        break;
    }
    QWidget::changeEvent(e);
}